

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

bool __thiscall
tsbp::LeftmostActiveOnly::IsPlacementFeasible
          (LeftmostActiveOnly *this,Packing2D *packing,Rectangle *itemToPlace)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  bool local_71;
  size_t x;
  size_t y;
  size_t maxY;
  size_t minY;
  reference local_38;
  Rectangle *local_28;
  Rectangle *itemToPlace_local;
  Packing2D *packing_local;
  LeftmostActiveOnly *this_local;
  
  if (((this->container).super_Rectangle.Dx < packing->ActiveX + itemToPlace->Dx) ||
     ((this->container).super_Rectangle.Dy < packing->ActiveY + itemToPlace->Dy)) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = itemToPlace;
    itemToPlace_local = (Rectangle *)packing;
    packing_local = (Packing2D *)this;
    pvVar4 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->itemSpecificPlacementPointsX,(long)itemToPlace->InternId);
    local_38 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar4,(long)itemToPlace_local->X);
    bVar3 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_38);
    local_71 = false;
    if (bVar3) {
      pvVar4 = std::
               vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&this->itemSpecificPlacementPointsY,(long)local_28->InternId);
      _minY = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (pvVar4,(long)itemToPlace_local->Y);
      local_71 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&minY);
    }
    if (((local_71 ^ 0xffU) & 1) == 0) {
      if ((itemToPlace_local->ExternId == itemToPlace_local->InternId) &&
         (itemToPlace_local->X == itemToPlace_local->ExternId)) {
        this_local._7_1_ = true;
      }
      else {
        iVar1 = itemToPlace_local->Y;
        iVar2 = local_28->Dy;
        for (x = (size_t)itemToPlace_local->Y; x < (ulong)(long)(iVar1 + iVar2); x = x + 1) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              &itemToPlace_local[2].InternId,x);
          if ((ulong)(long)itemToPlace_local->X < *pvVar5) {
            return false;
          }
        }
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LeftmostActiveOnly::IsPlacementFeasible(Packing2D& packing, const Rectangle& itemToPlace)
{
    if (packing.ActiveX + itemToPlace.Dx > this->container.Dx || packing.ActiveY + itemToPlace.Dy > this->container.Dy)
    {
        return false;
    }

    if (!(this->itemSpecificPlacementPointsX[itemToPlace.InternId][packing.ActiveX] && this->itemSpecificPlacementPointsY[itemToPlace.InternId][packing.ActiveY]))
    {
        return false;
    }

    if (packing.AbscissaMaxX == packing.MaxX && packing.ActiveX == packing.AbscissaMaxX)
    {
        return true;
    }

    size_t minY = packing.ActiveY;
    size_t maxY = packing.ActiveY + itemToPlace.Dy;

    for (size_t y = minY; y < maxY; y++)
    {
        size_t x = packing.PlacedAreaVector[y];

        if (x > packing.ActiveX)
        {
            return false;
        }
    }

    return true;

    /*
    // Checking intersections/crossing with boost geometry is about 18% slower than the manual overlap check below.
    typedef bg::model::point<int, 2, bg::cs::cartesian> Point2D;
    typedef bg::model::linestring<Point2D> Linestring2D;

    // Checking for crossing only with the west edge will not always produce expected true/false values. Need to add north and east edge as well.
    Linestring2D newRectangleWestEdge{ { packing.ActiveX, packing.ActiveY }, { packing.ActiveX, packing.ActiveY + item.Dy }, { packing.ActiveX + item.Dx, packing.ActiveY + item.Dy }, { packing.ActiveX + item.Dx, packing.ActiveY } };

    const bool isCrossing = boost::geometry::crosses(newRectangleWestEdge, packing.Layout.DeactivatedArea);
    if (isCrossing)
    {
        return false;
    }
    */

    /*
    // Naive overlap check. Worse performance than current solution.
    for (const Rectangle& rectangle : packing.Layout.Items)
    {
        // overlapDx > 0 && overlapDy > 0
        if (std::min(rectangle.X + rectangle.Dx, packing.ActiveX + item.Dx) - std::max(rectangle.X, packing.ActiveX) > 0
            && std::min(rectangle.Y + rectangle.Dy, packing.ActiveY + item.Dy) - std::max(rectangle.Y, packing.ActiveY) > 0)
        {
            return false;
        }
    }
    */
}